

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeLocalGet(TranslateToFuzzReader *this,Type type)

{
  iterator __position;
  undefined1 auVar1 [16];
  key_type kVar2;
  char cVar3;
  uint32_t uVar4;
  Index IVar5;
  mapped_type *vec;
  value_type_conflict3 *pvVar6;
  Expression *pEVar7;
  Type TVar8;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  Type in_R8;
  Index local_3c;
  Type TStack_38;
  Index index;
  Type type_local;
  
  TStack_38.id = type.id;
  vec = std::__detail::
        _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
        ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)&this->funcContext->typeLocals,&stack0xffffffffffffffc8);
  if ((vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    if (((this->trivialNesting != 0) || (uVar4 = Random::upTo(&this->random,3), uVar4 == 0)) ||
       (cVar3 = wasm::TypeUpdating::canHandleAsLocal(TStack_38), cVar3 == '\0')) {
      pEVar7 = makeConst(this,TStack_38);
      return pEVar7;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = TStack_38.id;
    IVar5 = Builder::addVar((Builder *)this->funcContext->func,(Function *)0x0,
                            (Name)(auVar1 << 0x40),in_R8);
    local_3c = IVar5;
    if ((uVar4 == 1) || ((TStack_38.id & 3) == 0 && 6 < TStack_38.id)) {
      pEVar7 = make(this,TStack_38);
      TVar8.id = (uintptr_t)
                 MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x20,8);
      *(undefined1 *)TVar8.id = 9;
      *(undefined8 *)(TVar8.id + 8) = 0;
      *(Index *)(TVar8.id + 0x10) = IVar5;
      *(Expression **)(TVar8.id + 0x18) = pEVar7;
      wasm::LocalSet::makeTee(TVar8);
    }
    else {
      TVar8.id = 0;
    }
    this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
              std::__detail::
              _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->funcContext->typeLocals,&stack0xffffffffffffffc8);
    __position._M_current = *(uint **)(this_00 + 8);
    if (__position._M_current == *(uint **)(this_00 + 0x10)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (this_00,__position,&local_3c);
    }
    else {
      *__position._M_current = IVar5;
      *(uint **)(this_00 + 8) = __position._M_current + 1;
    }
    IVar5 = local_3c;
    if ((Expression *)TVar8.id != (Expression *)0x0) {
      return (Expression *)TVar8.id;
    }
  }
  else {
    pvVar6 = Random::pick<std::vector<unsigned_int,std::allocator<unsigned_int>>>(&this->random,vec)
    ;
    IVar5 = *pvVar6;
  }
  kVar2.id = TStack_38.id;
  pEVar7 = (Expression *)MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x18,8)
  ;
  pEVar7->_id = LocalGetId;
  *(Index *)(pEVar7 + 1) = IVar5;
  (pEVar7->type).id = kVar2.id;
  return pEVar7;
}

Assistant:

Expression* TranslateToFuzzReader::makeLocalGet(Type type) {
  auto& locals = funcContext->typeLocals[type];
  if (!locals.empty()) {
    return builder.makeLocalGet(pick(locals), type);
  }
  // No existing local. When we want something trivial, just give up and emit a
  // constant.
  if (trivialNesting) {
    return makeConst(type);
  }

  // Otherwise, we have 3 cases: a const, as above (we do this randomly some of
  // the time), or emit a local.get of a new local, or emit a local.tee of a new
  // local.
  auto choice = upTo(3);
  if (choice == 0 || !TypeUpdating::canHandleAsLocal(type)) {
    return makeConst(type);
  }
  // Otherwise, add a new local. If the type is not non-nullable then we may
  // just emit a get for it (which, as this is a brand-new local, will read the
  // default value, unless we are in a loop; for that reason for a non-
  // nullable local we prefer a tee later down.).
  auto index = builder.addVar(funcContext->func, type);
  LocalSet* tee = nullptr;
  if (choice == 1 || type.isNonNullable()) {
    // Create the tee here before adding the local to typeLocals (or else we
    // might end up using it prematurely inside the make() call).
    tee = builder.makeLocalTee(index, make(type), type);
  }
  funcContext->typeLocals[type].push_back(index);
  if (tee) {
    return tee;
  }
  return builder.makeLocalGet(index, type);
}